

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void notice_stuff(player *p)

{
  uint uVar1;
  
  uVar1 = p->upkeep->notice;
  if (uVar1 != 0) {
    if ((uVar1 & 2) != 0) {
      p->upkeep->notice = uVar1 & 0xfffffffd;
      ignore_drop(p);
    }
    uVar1 = p->upkeep->notice;
    if ((uVar1 & 1) != 0) {
      p->upkeep->notice = uVar1 & 0xfffffffe;
      combine_pack(p);
    }
    uVar1 = p->upkeep->notice;
    if ((uVar1 & 4) != 0) {
      p->upkeep->notice = uVar1 & 0xfffffffb;
      show_monster_messages();
      return;
    }
  }
  return;
}

Assistant:

void notice_stuff(struct player *p)
{
	/* Notice stuff */
	if (!p->upkeep->notice) return;

	/* Deal with ignore stuff */
	if (p->upkeep->notice & PN_IGNORE) {
		p->upkeep->notice &= ~(PN_IGNORE);
		ignore_drop(p);
	}

	/* Combine the pack */
	if (p->upkeep->notice & PN_COMBINE) {
		p->upkeep->notice &= ~(PN_COMBINE);
		combine_pack(p);
	}

	/* Dump the monster messages */
	if (p->upkeep->notice & PN_MON_MESSAGE) {
		p->upkeep->notice &= ~(PN_MON_MESSAGE);

		/* Make sure this comes after all of the monster messages */
		show_monster_messages();
	}
}